

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowViewportThumbnails(void)

{
  undefined8 *puVar1;
  ImDrawList *pIVar2;
  ImFont *font;
  char *text_begin;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiContext *pIVar14;
  ImGuiWindow *pIVar15;
  ImU32 IVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  char *text_end;
  ImGuiWindow *this;
  uint uVar21;
  ImGuiViewportP *pIVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImRect viewport_draw_bb;
  ImRect thumb_r_scaled;
  ImVec4 local_148;
  float local_138;
  float local_134;
  ImVec2 local_130;
  ImVec2 IStack_128;
  float local_120;
  float local_11c;
  ImVec2 local_118;
  ImVec2 IStack_110;
  undefined1 local_108 [16];
  ImVec2 local_f0;
  ImVec2 IStack_e8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  ImGuiWindow *local_d0;
  undefined1 local_c8 [16];
  ImGuiContext *local_b0;
  ImGuiWindow *local_a8;
  ImDrawList *local_a0;
  long local_98;
  ImGuiViewportP *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  lVar17 = (long)(GImGui->Viewports).Size;
  if (lVar17 < 1) {
    local_88 = ZEXT816(0);
    local_78 = ZEXT816(0);
    local_11c = 0.0;
    local_120 = 0.0;
  }
  else {
    local_120 = 0.0;
    lVar19 = 0;
    local_11c = 0.0;
    fVar30 = 0.0;
    fVar26 = 0.0;
    do {
      pIVar22 = (GImGui->Viewports).Data[lVar19];
      fVar23 = (pIVar22->super_ImGuiViewport).Pos.x;
      fVar24 = (pIVar22->super_ImGuiViewport).Pos.y;
      fVar32 = (pIVar22->super_ImGuiViewport).Size.x + fVar23;
      if (fVar32 <= fVar30) {
        fVar32 = fVar30;
      }
      fVar30 = fVar32;
      local_78 = ZEXT416((uint)fVar30);
      fVar32 = (pIVar22->super_ImGuiViewport).Size.y + fVar24;
      if (fVar32 <= fVar26) {
        fVar32 = fVar26;
      }
      fVar26 = fVar32;
      local_88 = ZEXT416((uint)fVar26);
      if (local_120 <= fVar23) {
        fVar23 = local_120;
      }
      local_120 = fVar23;
      if (local_11c <= fVar24) {
        fVar24 = local_11c;
      }
      local_11c = fVar24;
      lVar19 = lVar19 + 1;
    } while (lVar17 != lVar19);
  }
  if (0 < (GImGui->Viewports).Size) {
    local_a8 = GImGui->CurrentWindow;
    local_dc = (local_a8->DC).CursorPos.x - local_120 * 0.125;
    local_e0 = (local_a8->DC).CursorPos.y - local_11c * 0.125;
    lVar17 = 0;
    local_b0 = GImGui;
    do {
      pIVar14 = GImGui;
      pIVar22 = (local_b0->Viewports).Data[lVar17];
      fVar30 = (pIVar22->super_ImGuiViewport).Pos.x;
      fVar26 = (pIVar22->super_ImGuiViewport).Pos.y;
      local_134 = fVar30 * 0.125 + local_dc;
      local_138 = fVar26 * 0.125 + local_e0;
      local_d4 = (pIVar22->super_ImGuiViewport).Size.x;
      IStack_128.x = (fVar30 + local_d4) * 0.125 + local_dc;
      IStack_128.y = (fVar26 + (pIVar22->super_ImGuiViewport).Size.y) * 0.125 + local_e0;
      local_a0 = local_a8->DrawList;
      local_d0 = GImGui->CurrentWindow;
      local_d8 = (IStack_128.y - local_138) / (pIVar22->super_ImGuiViewport).Size.y;
      local_d4 = (IStack_128.x - local_134) / local_d4;
      local_108._0_4_ = (pIVar22->super_ImGuiViewport).Pos.x * local_d4;
      fVar30 = *(float *)(&DAT_0020c89c +
                         (ulong)(-1 < (char)(pIVar22->super_ImGuiViewport).Flags) * 4);
      pIVar2 = local_d0->DrawList;
      local_148.x = (GImGui->Style).Colors[5].x;
      local_148.y = (GImGui->Style).Colors[5].y;
      uVar3 = (GImGui->Style).Colors[5].z;
      uVar4 = (GImGui->Style).Colors[5].w;
      local_c8._0_4_ = (pIVar22->super_ImGuiViewport).Pos.y * local_d8;
      local_148.w = fVar30 * 0.4 * (GImGui->Style).Alpha * (float)uVar4;
      local_148.z = (float)uVar3;
      local_130.x = local_134;
      local_130.y = local_138;
      local_98 = lVar17;
      IVar16 = ColorConvertFloat4ToU32(&local_148);
      ImDrawList::AddRectFilled(pIVar2,&local_130,&IStack_128,IVar16,0.0,0xf);
      uVar21 = (pIVar14->Windows).Size;
      uVar18 = (ulong)uVar21;
      if (uVar21 != 0) {
        local_134 = local_134 - (float)local_108._0_4_;
        local_138 = local_138 - (float)local_c8._0_4_;
        uVar20 = 0;
        local_90 = pIVar22;
        do {
          if ((long)(int)uVar18 <= (long)uVar20) {
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                          ,0x62f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
          }
          this = (pIVar14->Windows).Data[uVar20];
          if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
             (this->Viewport == pIVar22)) {
            fVar26 = (this->Pos).x;
            local_68 = ZEXT416((uint)fVar26);
            fVar23 = (this->Pos).y;
            local_58 = ZEXT416((uint)fVar23);
            local_c8 = ZEXT416((uint)((this->Size).x + fVar26));
            local_48 = ZEXT416((uint)((this->Size).y + fVar23));
            local_108 = ZEXT416((uint)((this->SizeFull).x + fVar26));
            ImGuiWindow::TitleBarHeight(this);
            pIVar15 = local_d0;
            fVar32 = (float)(int)((float)local_68._0_4_ * local_d4 + local_134);
            fVar27 = (float)(int)((float)local_58._0_4_ * local_d8 + local_138);
            fVar28 = (float)(int)((float)local_c8._0_4_ * local_d4 + local_134);
            fVar31 = (float)(int)((float)local_48._0_4_ * local_d8 + local_138);
            fVar25 = (float)(int)(local_d4 * (this->Pos).x + local_134);
            fVar23 = (float)(int)((this->Pos).y * local_d8 + local_138);
            fVar29 = (float)(int)((float)local_108._0_4_ * local_d4 + local_134);
            fVar24 = fVar23 + 5.0;
            fVar26 = local_130.y;
            if ((local_130.y <= fVar27) && (fVar26 = IStack_128.y, fVar27 <= IStack_128.y)) {
              fVar26 = fVar27;
            }
            fVar27 = IStack_128.x;
            if (fVar32 <= IStack_128.x) {
              fVar27 = fVar32;
            }
            local_118.x = (float)(-(uint)(fVar32 < local_130.x) & (uint)local_130.x |
                                 ~-(uint)(fVar32 < local_130.x) & (uint)fVar27);
            local_118.y = fVar26;
            fVar26 = local_130.y;
            if ((local_130.y <= fVar31) && (fVar26 = IStack_128.y, fVar31 <= IStack_128.y)) {
              fVar26 = fVar31;
            }
            fVar32 = IStack_128.x;
            if (fVar28 <= IStack_128.x) {
              fVar32 = fVar28;
            }
            IStack_110.x = (float)(-(uint)(fVar28 < local_130.x) & (uint)local_130.x |
                                  ~-(uint)(fVar28 < local_130.x) & (uint)fVar32);
            IStack_110.y = fVar26;
            fVar26 = local_130.y;
            if ((local_130.y <= fVar23) && (fVar26 = IStack_128.y, fVar23 <= IStack_128.y)) {
              fVar26 = fVar23;
            }
            fVar23 = IStack_128.x;
            if (fVar25 <= IStack_128.x) {
              fVar23 = fVar25;
            }
            local_f0.x = (float)(-(uint)(fVar25 < local_130.x) & (uint)local_130.x |
                                ~-(uint)(fVar25 < local_130.x) & (uint)fVar23);
            local_f0.y = fVar26;
            IStack_e8.y = local_130.y;
            if ((local_130.y <= fVar24) && (IStack_e8.y = IStack_128.y, fVar24 <= IStack_128.y)) {
              IStack_e8.y = fVar24;
            }
            fVar26 = IStack_128.x;
            if (fVar29 <= IStack_128.x) {
              fVar26 = fVar29;
            }
            IStack_e8.x = (float)(-(uint)(fVar29 < local_130.x) & (uint)local_130.x |
                                 ~-(uint)(fVar29 < local_130.x) & (uint)fVar26);
            if (pIVar14->NavWindow == (ImGuiWindow *)0x0) {
              uVar21 = 10;
            }
            else {
              uVar21 = this->RootWindowForTitleBarHighlight ==
                       pIVar14->NavWindow->RootWindowForTitleBarHighlight | 10;
            }
            local_148.x = (GImGui->Style).Colors[2].x;
            local_148.y = (GImGui->Style).Colors[2].y;
            uVar5 = (GImGui->Style).Colors[2].z;
            uVar6 = (GImGui->Style).Colors[2].w;
            local_148.w = (GImGui->Style).Alpha * fVar30 * (float)uVar6;
            local_148.z = (float)uVar5;
            local_108._0_8_ = local_d0->DrawList;
            IVar16 = ColorConvertFloat4ToU32(&local_148);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)local_108._0_8_,&local_118,&IStack_110,IVar16,0.0,0xf);
            local_108._0_8_ = pIVar15->DrawList;
            puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar21 << 4));
            local_148._0_8_ = *puVar1;
            uVar7 = puVar1[1];
            local_148.w = (float)((ulong)uVar7 >> 0x20);
            local_148.z = (float)uVar7;
            local_148.w = (GImGui->Style).Alpha * fVar30 * local_148.w;
            IVar16 = ColorConvertFloat4ToU32(&local_148);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)local_108._0_8_,&local_f0,&IStack_e8,IVar16,0.0,0xf);
            pIVar2 = pIVar15->DrawList;
            local_148.x = (GImGui->Style).Colors[5].x;
            local_148.y = (GImGui->Style).Colors[5].y;
            uVar8 = (GImGui->Style).Colors[5].z;
            uVar9 = (GImGui->Style).Colors[5].w;
            local_148.w = (GImGui->Style).Alpha * fVar30 * (float)uVar9;
            local_148.z = (float)uVar8;
            IVar16 = ColorConvertFloat4ToU32(&local_148);
            ImDrawList::AddRect(pIVar2,&local_118,&IStack_110,IVar16,0.0,0xf,1.0);
            if (this->DockNodeAsHost != (ImGuiDockNode *)0x0) {
              this = this->DockNodeAsHost->VisibleWindow;
            }
            pIVar22 = local_90;
            if (this != (ImGuiWindow *)0x0) {
              pIVar2 = local_d0->DrawList;
              font = pIVar14->Font;
              local_108._0_4_ = pIVar14->FontSize;
              local_148.x = (GImGui->Style).Colors[0].x;
              local_148.y = (GImGui->Style).Colors[0].y;
              uVar10 = (GImGui->Style).Colors[0].z;
              uVar11 = (GImGui->Style).Colors[0].w;
              local_148.w = (GImGui->Style).Alpha * fVar30 * (float)uVar11;
              local_148.z = (float)uVar10;
              IVar16 = ColorConvertFloat4ToU32(&local_148);
              text_begin = this->Name;
              text_end = text_begin;
              if (text_begin != (char *)0xffffffffffffffff) {
                do {
                  if (*text_end == '#') {
                    if (text_end[1] == '#') goto LAB_001efac6;
                  }
                  else if (*text_end == '\0') goto LAB_001efac6;
                  text_end = text_end + 1;
                } while (text_end != (char *)0xffffffffffffffff);
                text_end = (char *)0xffffffffffffffff;
              }
LAB_001efac6:
              ImDrawList::AddText(pIVar2,font,(float)local_108._0_4_,&local_f0,IVar16,text_begin,
                                  text_end,0.0,(ImVec4 *)0x0);
              pIVar22 = local_90;
            }
          }
          uVar20 = uVar20 + 1;
          uVar18 = (ulong)(uint)(pIVar14->Windows).Size;
        } while (uVar20 != uVar18);
      }
      local_148.x = (GImGui->Style).Colors[5].x;
      local_148.y = (GImGui->Style).Colors[5].y;
      uVar12 = (GImGui->Style).Colors[5].z;
      uVar13 = (GImGui->Style).Colors[5].w;
      local_148.w = fVar30 * (GImGui->Style).Alpha * (float)uVar13;
      local_148.z = (float)uVar12;
      IVar16 = ColorConvertFloat4ToU32(&local_148);
      ImDrawList::AddRect(local_a0,&local_130,&IStack_128,IVar16,0.0,0xf,1.0);
      lVar17 = local_98 + 1;
    } while (lVar17 < (local_b0->Viewports).Size);
  }
  local_148.y = ((float)local_88._0_4_ - local_11c) * 0.125;
  local_148.x = ((float)local_78._0_4_ - local_120) * 0.125;
  Dummy((ImVec2 *)&local_148);
  return;
}

Assistant:

void ImGui::ShowViewportThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    bb_full.Add(GetPlatformMonitorMainRect(g.PlatformIO.Monitors[n]));
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetMainRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    window->DrawList->AddRect(off + g.PlatformIO.Monitors[n].MainPos * SCALE, off + (g.PlatformIO.Monitors[n].MainPos + g.PlatformIO.Monitors[n].MainSize) * SCALE, ImGui::GetColorU32(ImGuiCol_Border));
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        RenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}